

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O0

void __thiscall
duckdb::ParquetWriter::PrepareRowGroup
          (ParquetWriter *this,ColumnDataCollection *buffer,PreparedRowGroup *result)

{
  ulong uVar1;
  ColumnDataCollection *pCVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  idx_t iVar7;
  reference pvVar8;
  ColumnWriter *pCVar9;
  type pCVar10;
  reference pvVar11;
  long in_RDX;
  ColumnDataCollection *in_RSI;
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
  *write_state_1;
  iterator __end2_4;
  iterator __begin2_4;
  vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
  *__range2_4;
  idx_t i_5;
  DataChunk *chunk_2;
  ColumnDataChunkIterator __end2_3;
  ColumnDataChunkIterator __begin2_3;
  ColumnDataChunkIterationHelper *__range2_3;
  idx_t i_4;
  idx_t i_3;
  DataChunk *chunk_1;
  ColumnDataChunkIterator __end2_2;
  ColumnDataChunkIterator __begin2_2;
  ColumnDataChunkIterationHelper *__range2_2;
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
  *write_state;
  iterator __end2_1;
  iterator __begin2_1;
  vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
  *__range2_1;
  idx_t i_2;
  idx_t i_1;
  DataChunk *chunk;
  ColumnDataChunkIterator __end2;
  ColumnDataChunkIterator __begin2;
  ColumnDataChunkIterationHelper *__range2;
  idx_t i;
  vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
  write_states;
  vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> col_writers;
  vector<unsigned_long,_true> column_ids;
  unsigned_long next;
  idx_t col_idx;
  vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
  *states;
  RowGroup *row_group;
  vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
  *in_stack_fffffffffffff8c8;
  ColumnDataChunkIterator *in_stack_fffffffffffff8d0;
  ColumnWriter *in_stack_fffffffffffff8d8;
  type in_stack_fffffffffffff8e0;
  reference in_stack_fffffffffffff8f8;
  DataChunk *in_stack_fffffffffffff900;
  undefined7 in_stack_fffffffffffff908;
  byte in_stack_fffffffffffff90f;
  ColumnDataCollection *in_stack_fffffffffffff910;
  __normal_iterator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>_>
  local_598;
  undefined1 *local_590;
  ulong local_588;
  DataChunk *local_580;
  ColumnDataChunkIterator local_578 [160];
  ColumnDataChunkIterator local_4d8 [160];
  undefined1 local_438 [24];
  undefined1 local_420 [32];
  undefined1 *local_400;
  ulong local_3f8;
  ulong local_3f0;
  DataChunk *local_3e8;
  ColumnDataChunkIterator local_3e0 [160];
  ColumnDataChunkIterator local_340 [160];
  undefined1 local_2a0 [24];
  undefined1 local_288 [32];
  undefined1 *local_268;
  reference local_260;
  unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
  *local_258;
  __normal_iterator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>_>
  local_250;
  undefined1 *local_248;
  ulong local_240;
  ulong local_238;
  DataChunk *local_230;
  ColumnDataChunkIterator local_228 [160];
  ColumnDataChunkIterator local_188 [160];
  undefined1 local_e8 [24];
  undefined1 local_d0 [32];
  undefined1 *local_b0;
  undefined1 local_a8 [24];
  long local_90;
  ulong local_88;
  undefined1 local_80 [72];
  unsigned_long local_38;
  ulong local_30;
  long local_28;
  long local_20;
  long local_18;
  ColumnDataCollection *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ColumnDataCollection::Count(in_RSI);
  lVar6 = NumericCast<long,unsigned_long,void>(0x6beb74);
  *(long *)(local_20 + 0x28) = lVar6;
  *(byte *)(local_20 + 0x5a) = *(byte *)(local_20 + 0x5a) & 0xfd | 2;
  local_28 = local_18 + 0x60;
  for (local_30 = 0; uVar1 = local_30,
      iVar7 = ColumnDataCollection::ColumnCount((ColumnDataCollection *)0x6bebd4), uVar1 < iVar7;
      local_30 = local_30 + 8) {
    iVar7 = ColumnDataCollection::ColumnCount((ColumnDataCollection *)0x6bebf5);
    local_38 = MinValue<unsigned_long>(iVar7 - local_30,8);
    vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0x6bec1f);
    vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::vector
              ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)0x6bec2c);
    vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
    ::vector((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
              *)0x6bec39);
    for (local_88 = 0; pCVar2 = local_10, local_88 < local_38; local_88 = local_88 + 1) {
      local_90 = local_30 + local_88;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8e0,
                 (unsigned_long *)in_stack_fffffffffffff8d8);
      vector<unsigned_long,_true>::back((vector<unsigned_long,_true> *)in_stack_fffffffffffff910);
      vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
                    *)in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8);
      unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>::operator*
                ((unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                  *)in_stack_fffffffffffff8d0);
      std::
      vector<std::reference_wrapper<duckdb::ColumnWriter>,std::allocator<std::reference_wrapper<duckdb::ColumnWriter>>>
      ::emplace_back<duckdb::ColumnWriter&>
                ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_std::allocator<std::reference_wrapper<duckdb::ColumnWriter>_>_>
                  *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
      pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::back
                         ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                          in_stack_fffffffffffff910);
      pCVar9 = std::reference_wrapper<duckdb::ColumnWriter>::get(pvVar8);
      (*pCVar9->_vptr_ColumnWriter[2])(local_a8,pCVar9,local_20);
      std::
      vector<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ColumnWriterState,std::default_delete<duckdb::ColumnWriterState>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                  *)in_stack_fffffffffffff8e0,
                 (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                  *)in_stack_fffffffffffff8d8);
      unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>::
      ~unique_ptr((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                   *)0x6bed70);
    }
    vector<unsigned_long,_true>::vector
              ((vector<unsigned_long,_true> *)in_stack_fffffffffffff8d0,
               (vector<unsigned_long,_true> *)in_stack_fffffffffffff8c8);
    duckdb::ColumnDataCollection::Chunks(local_d0,pCVar2,local_e8);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x6bee1b);
    local_b0 = local_d0;
    ColumnDataChunkIterationHelper::begin
              ((ColumnDataChunkIterationHelper *)
               CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    ColumnDataChunkIterationHelper::end
              ((ColumnDataChunkIterationHelper *)
               CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    while (bVar3 = duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                             (local_188,local_228), (bVar3 & 1) != 0) {
      local_230 = (DataChunk *)
                  duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*
                            (local_188);
      for (local_238 = 0; local_238 < local_38; local_238 = local_238 + 1) {
        pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                           ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                            in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8);
        pCVar9 = std::reference_wrapper<duckdb::ColumnWriter>::get(pvVar8);
        uVar5 = (*pCVar9->_vptr_ColumnWriter[3])();
        if ((uVar5 & 1) != 0) {
          pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                             ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                              in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8);
          pCVar9 = std::reference_wrapper<duckdb::ColumnWriter>::get(pvVar8);
          vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
          ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                        *)in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8);
          pCVar10 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                    ::operator*((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                                 *)in_stack_fffffffffffff8d0);
          pvVar11 = vector<duckdb::Vector,_true>::operator[]
                              ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff8d0,
                               (size_type)in_stack_fffffffffffff8c8);
          iVar7 = DataChunk::size(local_230);
          (*pCVar9->_vptr_ColumnWriter[4])(pCVar9,pCVar10,0,pvVar11,iVar7);
        }
      }
      duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(local_188);
    }
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator
              (in_stack_fffffffffffff8d0);
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator
              (in_stack_fffffffffffff8d0);
    ColumnDataChunkIterationHelper::~ColumnDataChunkIterationHelper
              ((ColumnDataChunkIterationHelper *)0x6beeb1);
    for (local_240 = 0; local_240 < local_38; local_240 = local_240 + 1) {
      pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                         ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                          in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8);
      pCVar9 = std::reference_wrapper<duckdb::ColumnWriter>::get(pvVar8);
      uVar5 = (*pCVar9->_vptr_ColumnWriter[3])();
      if ((uVar5 & 1) != 0) {
        pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                           ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                            in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8);
        pCVar9 = std::reference_wrapper<duckdb::ColumnWriter>::get(pvVar8);
        vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                      *)in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8);
        pCVar10 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                  ::operator*((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                               *)in_stack_fffffffffffff8d0);
        (*pCVar9->_vptr_ColumnWriter[5])(pCVar9,pCVar10);
      }
    }
    local_248 = local_80;
    local_250._M_current =
         (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
          *)std::
            vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
            ::begin(in_stack_fffffffffffff8c8);
    local_258 = (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                 *)std::
                   vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                   ::end(in_stack_fffffffffffff8c8);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>_>
                               *)in_stack_fffffffffffff8d0,
                              (__normal_iterator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>_>
                               *)in_stack_fffffffffffff8c8), pCVar2 = local_10, bVar4) {
      local_260 = __gnu_cxx::
                  __normal_iterator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>_>
                  ::operator*(&local_250);
      unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>::
      operator->((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                  *)in_stack_fffffffffffff8d0);
      ColumnDataCollection::Count(local_10);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 in_stack_fffffffffffff900,(size_type)in_stack_fffffffffffff8f8);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>_>
      ::operator++(&local_250);
    }
    vector<unsigned_long,_true>::vector
              ((vector<unsigned_long,_true> *)in_stack_fffffffffffff8d0,
               (vector<unsigned_long,_true> *)in_stack_fffffffffffff8c8);
    duckdb::ColumnDataCollection::Chunks(local_288,pCVar2,local_2a0);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x6bf332);
    local_268 = local_288;
    ColumnDataChunkIterationHelper::begin
              ((ColumnDataChunkIterationHelper *)
               CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    ColumnDataChunkIterationHelper::end
              ((ColumnDataChunkIterationHelper *)
               CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    while (bVar3 = duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                             (local_340,local_3e0), (bVar3 & 1) != 0) {
      local_3e8 = (DataChunk *)
                  duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*
                            (local_340);
      for (local_3f0 = 0; local_3f0 < local_38; local_3f0 = local_3f0 + 1) {
        pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                           ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                            in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8);
        pCVar9 = std::reference_wrapper<duckdb::ColumnWriter>::get(pvVar8);
        vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                      *)in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8);
        pCVar10 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                  ::operator*((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                               *)in_stack_fffffffffffff8d0);
        pvVar11 = vector<duckdb::Vector,_true>::operator[]
                            ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff8d0,
                             (size_type)in_stack_fffffffffffff8c8);
        iVar7 = DataChunk::size(local_3e8);
        (*pCVar9->_vptr_ColumnWriter[6])(pCVar9,pCVar10,0,pvVar11,iVar7);
      }
      duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(local_340);
    }
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator
              (in_stack_fffffffffffff8d0);
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator
              (in_stack_fffffffffffff8d0);
    ColumnDataChunkIterationHelper::~ColumnDataChunkIterationHelper
              ((ColumnDataChunkIterationHelper *)0x6bf3c8);
    for (local_3f8 = 0; local_3f8 < local_38; local_3f8 = local_3f8 + 1) {
      pvVar8 = vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                         ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                          in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8);
      pCVar9 = std::reference_wrapper<duckdb::ColumnWriter>::get(pvVar8);
      vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                    *)in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8);
      pCVar10 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                ::operator*((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                             *)in_stack_fffffffffffff8d0);
      (*pCVar9->_vptr_ColumnWriter[7])(pCVar9,pCVar10);
    }
    in_stack_fffffffffffff910 = local_10;
    vector<unsigned_long,_true>::vector
              ((vector<unsigned_long,_true> *)in_stack_fffffffffffff8d0,
               (vector<unsigned_long,_true> *)in_stack_fffffffffffff8c8);
    duckdb::ColumnDataCollection::Chunks(local_420,in_stack_fffffffffffff910,local_438);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x6bf69c);
    local_400 = local_420;
    ColumnDataChunkIterationHelper::begin
              ((ColumnDataChunkIterationHelper *)
               CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    ColumnDataChunkIterationHelper::end
              ((ColumnDataChunkIterationHelper *)
               CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908));
    while (in_stack_fffffffffffff90f =
                duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                          (local_4d8,local_578), (in_stack_fffffffffffff90f & 1) != 0) {
      in_stack_fffffffffffff900 =
           (DataChunk *)
           duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(local_4d8);
      local_580 = in_stack_fffffffffffff900;
      for (local_588 = 0; local_588 < local_38; local_588 = local_588 + 1) {
        in_stack_fffffffffffff8f8 =
             vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::operator[]
                       ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)
                        in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8);
        pCVar9 = std::reference_wrapper<duckdb::ColumnWriter>::get(in_stack_fffffffffffff8f8);
        vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                      *)in_stack_fffffffffffff8d0,(size_type)in_stack_fffffffffffff8c8);
        in_stack_fffffffffffff8e0 =
             unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
             ::operator*((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                          *)in_stack_fffffffffffff8d0);
        in_stack_fffffffffffff8d8 =
             (ColumnWriter *)
             vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff8d0,
                        (size_type)in_stack_fffffffffffff8c8);
        in_stack_fffffffffffff8d0 = (ColumnDataChunkIterator *)DataChunk::size(local_580);
        (*pCVar9->_vptr_ColumnWriter[8])
                  (pCVar9,in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
                   in_stack_fffffffffffff8d0);
      }
      duckdb::ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(local_4d8);
    }
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator
              (in_stack_fffffffffffff8d0);
    ColumnDataChunkIterationHelper::ColumnDataChunkIterator::~ColumnDataChunkIterator
              (in_stack_fffffffffffff8d0);
    ColumnDataChunkIterationHelper::~ColumnDataChunkIterationHelper
              ((ColumnDataChunkIterationHelper *)0x6bf72c);
    local_590 = local_80;
    local_598._M_current =
         (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
          *)std::
            vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
            ::begin(in_stack_fffffffffffff8c8);
    std::
    vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
    ::end(in_stack_fffffffffffff8c8);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>_>
                               *)in_stack_fffffffffffff8d0,
                              (__normal_iterator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>_>
                               *)in_stack_fffffffffffff8c8), bVar4) {
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>_>
      ::operator*(&local_598);
      std::
      vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
      ::push_back((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                   *)in_stack_fffffffffffff8d0,(value_type *)in_stack_fffffffffffff8c8);
      __gnu_cxx::
      __normal_iterator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>_>
      ::operator++(&local_598);
    }
    vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
               *)0x6bf988);
    vector<std::reference_wrapper<duckdb::ColumnWriter>,_true>::~vector
              ((vector<std::reference_wrapper<duckdb::ColumnWriter>,_true> *)0x6bf995);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x6bf9a2);
  }
  return;
}

Assistant:

void ParquetWriter::PrepareRowGroup(ColumnDataCollection &buffer, PreparedRowGroup &result) {
	// We write 8 columns at a time so that iterating over ColumnDataCollection is more efficient
	static constexpr idx_t COLUMNS_PER_PASS = 8;

	// We want these to be buffer-managed
	D_ASSERT(buffer.GetAllocatorType() == ColumnDataAllocatorType::BUFFER_MANAGER_ALLOCATOR);

	// set up a new row group for this chunk collection
	auto &row_group = result.row_group;
	row_group.num_rows = NumericCast<int64_t>(buffer.Count());
	row_group.__isset.file_offset = true;

	auto &states = result.states;
	// iterate over each of the columns of the chunk collection and write them
	D_ASSERT(buffer.ColumnCount() == column_writers.size());
	for (idx_t col_idx = 0; col_idx < buffer.ColumnCount(); col_idx += COLUMNS_PER_PASS) {
		const auto next = MinValue<idx_t>(buffer.ColumnCount() - col_idx, COLUMNS_PER_PASS);
		vector<column_t> column_ids;
		vector<reference<ColumnWriter>> col_writers;
		vector<unique_ptr<ColumnWriterState>> write_states;
		for (idx_t i = 0; i < next; i++) {
			column_ids.emplace_back(col_idx + i);
			col_writers.emplace_back(*column_writers[column_ids.back()]);
			write_states.emplace_back(col_writers.back().get().InitializeWriteState(row_group));
		}

		for (auto &chunk : buffer.Chunks({column_ids})) {
			for (idx_t i = 0; i < next; i++) {
				if (col_writers[i].get().HasAnalyze()) {
					col_writers[i].get().Analyze(*write_states[i], nullptr, chunk.data[i], chunk.size());
				}
			}
		}

		for (idx_t i = 0; i < next; i++) {
			if (col_writers[i].get().HasAnalyze()) {
				col_writers[i].get().FinalizeAnalyze(*write_states[i]);
			}
		}

		// Reserving these once at the start really pays off
		for (auto &write_state : write_states) {
			write_state->definition_levels.reserve(buffer.Count());
		}

		for (auto &chunk : buffer.Chunks({column_ids})) {
			for (idx_t i = 0; i < next; i++) {
				col_writers[i].get().Prepare(*write_states[i], nullptr, chunk.data[i], chunk.size());
			}
		}

		for (idx_t i = 0; i < next; i++) {
			col_writers[i].get().BeginWrite(*write_states[i]);
		}

		for (auto &chunk : buffer.Chunks({column_ids})) {
			for (idx_t i = 0; i < next; i++) {
				col_writers[i].get().Write(*write_states[i], chunk.data[i], chunk.size());
			}
		}

		for (auto &write_state : write_states) {
			states.push_back(std::move(write_state));
		}
	}
}